

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O0

int fdsocket_infd_cmp(void *av,void *bv)

{
  FdSocket *b;
  FdSocket *a;
  void *bv_local;
  void *av_local;
  
  if (*(int *)((long)av + 4) < *(int *)((long)bv + 4)) {
    av_local._4_4_ = -1;
  }
  else if (*(int *)((long)bv + 4) < *(int *)((long)av + 4)) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int fdsocket_infd_cmp(void *av, void *bv)
{
    FdSocket *a = (FdSocket *)av;
    FdSocket *b = (FdSocket *)bv;
    if (a->infd < b->infd)
        return -1;
    if (a->infd > b->infd)
        return +1;
    return 0;
}